

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  int *piVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_03;
  char **ppcVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  string *input_stream;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  int num_target_order;
  int num_source_order;
  vector<double,_std::allocator<double>_> coefficients;
  int num_mixture;
  vector<double,_std::allocator<double>_> weights;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  source_vectors;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  window_coefficients;
  vector<double,_std::allocator<double>_> coefficients_1;
  double magic_number;
  ostringstream error_message;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  target_vectors;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> covariance_matrices;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mean_vectors;
  option long_options [2];
  int local_514;
  int local_510;
  int local_50c;
  string local_508;
  int local_4dc;
  char *local_4d8;
  char **local_4d0;
  ulong local_4c8;
  vector<double,_std::allocator<double>_> local_4c0;
  vector<double,_std::allocator<double>_> local_4a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_488;
  ulong local_470;
  undefined1 local_468 [8];
  double *pdStack_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458 [6];
  ios_base local_3f8 [24];
  bool local_3e0;
  undefined8 local_2e8;
  ulong local_2e0;
  double local_2d8;
  string local_2d0;
  byte abStack_2b0 [80];
  ios_base local_260 [408];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_c8;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_90;
  option local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_4d8 = (char *)CONCAT44(local_4d8._4_4_,argc);
  local_50c = 0x19;
  local_510 = 0x19;
  local_4dc = 0x10;
  local_488.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8 = 0;
  local_2d8 = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.flag = (int *)0x0;
  local_78.val = 1000;
  local_78._28_4_ = 0;
  local_78.name = "magic";
  local_78.has_arg = 1;
  local_78._12_4_ = 0;
  local_4c8 = 0;
  local_2e0 = 0;
  local_470 = 0;
  local_514 = 0;
  local_4d0 = argv;
  do {
    iVar4 = ya_getopt_long_only((int)local_4d8,argv,"l:m:L:M:k:fd:D:r:h",&local_78,(int *)0x0);
    bVar2 = true;
    if (iVar4 < 0x4d) {
      if (iVar4 == 0x44) {
        if ((local_4c8 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,"-D and -r options cannot be specified at the same time",
                     0x36);
          local_468 = (undefined1  [8])local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
          sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
          goto LAB_00104aba;
        }
        std::ifstream::ifstream(&local_2d0);
        std::ifstream::open((char *)&local_2d0,(_Ios_Openmode)ya_optarg);
        if ((abStack_2b0[*(long *)(local_2d0._M_dataplus._M_p + -0x18)] & 5) == 0) {
          local_468 = (undefined1  [8])0x0;
          pdStack_460 = (double *)0x0;
          local_458[0]._M_allocated_capacity = (double *)0x0;
          while (bVar1 = sptk::ReadStream<double>((double *)&local_508,(istream *)&local_2d0), bVar1
                ) {
            if (pdStack_460 == (double *)local_458[0]._0_8_) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)local_468,(iterator)pdStack_460,
                         (double *)&local_508);
            }
            else {
              *pdStack_460 = (double)local_508._M_dataplus._M_p;
              pdStack_460 = pdStack_460 + 1;
            }
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&local_488,(value_type *)local_468);
          if (local_468 != (undefined1  [8])0x0) {
            operator_delete((void *)local_468);
          }
          std::ifstream::~ifstream(&local_2d0);
          goto LAB_001043ae;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_468,"Cannot open file ",0x11);
        pcVar10 = ya_optarg;
        if (ya_optarg == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffffad8 +
                          (int)*(undefined8 *)((long)local_468 + -0x18) + 0xc0);
        }
        else {
          sVar8 = strlen(ya_optarg);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468,pcVar10,sVar8);
        }
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vc","");
        sptk::PrintErrorMessage(&local_508,(ostringstream *)local_468);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
        std::ios_base::~ios_base(local_3f8);
        std::ifstream::~ifstream(&local_2d0);
      }
      else {
        if (iVar4 == 0x4c) {
          std::__cxx11::string::string((string *)&local_2d0,ya_optarg,(allocator *)local_468);
          bVar1 = sptk::ConvertStringToInteger(&local_2d0,&local_510);
          bVar2 = 0 < local_510;
          paVar5 = &local_2d0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != paVar5) {
            operator_delete(local_2d0._M_dataplus._M_p);
            paVar5 = extraout_RAX;
          }
          if (bVar1 && bVar2) {
            local_510 = local_510 + -1;
            local_470 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
            goto LAB_00103e93;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,
                     "The argument for the -L option must be a positive integer",0x39);
          local_468 = (undefined1  [8])local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
          sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
        }
        else {
          if (iVar4 != -1) goto switchD_00103be7_caseD_65;
          if ((local_470 & 1) == 0) {
            local_510 = local_50c;
          }
          if ((int)local_4d8 - ya_optind == 1) {
            ppcVar7 = argv + (long)(int)local_4d8 + -1;
            pcVar10 = (char *)0x0;
          }
          else {
            if ((int)local_4d8 - ya_optind != 2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2d0,
                         "Just two input files, gmmfile and infile, are required",0x36);
              local_468 = (undefined1  [8])local_458;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
              sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
              goto LAB_00104aba;
            }
            ppcVar7 = argv + (long)(int)local_4d8 + -2;
            pcVar10 = ppcVar7[1];
          }
          __s = *ppcVar7;
          bVar2 = sptk::SetBinaryMode();
          if (bVar2) {
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_4c0,(long)local_4dc,(allocator_type *)&local_2d0);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector(&local_90,(long)local_4dc,(allocator_type *)&local_2d0);
            std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                      (&local_a8,(long)local_4dc,(allocator_type *)&local_2d0);
            std::ifstream::ifstream(&local_2d0);
            local_4d8 = pcVar10;
            std::ifstream::open((char *)&local_2d0,(_Ios_Openmode)__s);
            if ((abStack_2b0[*(long *)(local_2d0._M_dataplus._M_p + -0x18)] & 5) == 0) {
              if (local_4dc < 1) goto LAB_00104d1c;
              iVar4 = (local_50c + local_510 + 2) *
                      ((int)((ulong)((long)local_488.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_488.
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x55555555 + 1);
              lVar12 = 0;
              lVar15 = 0;
              lVar14 = 0;
              lVar11 = 0;
              local_4d0 = (char **)CONCAT44(local_4d0._4_4_,iVar4);
              goto LAB_00104b70;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_468,"Cannot open file ",0x11);
            if (__s == (char *)0x0) {
              std::ios::clear((int)&stack0xfffffffffffffad8 +
                              (int)*(undefined8 *)((long)local_468 + -0x18) + 0xc0);
            }
            else {
              sVar8 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468,__s,sVar8);
            }
            local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vc","");
            sptk::PrintErrorMessage(&local_508,(ostringstream *)local_468);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p == &local_508.field_2) goto LAB_00104eb7;
            goto LAB_00104eb2;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,"Cannot set translation mode",0x1b);
          local_468 = (undefined1  [8])local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
          sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
        }
LAB_00104aba:
        if (local_468 != (undefined1  [8])local_458) {
          operator_delete((void *)local_468);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d0);
        std::ios_base::~ios_base(local_260);
      }
      local_514 = 1;
      break;
    }
    if (iVar4 - 100U < 0xf) {
      switch(iVar4) {
      case 100:
        if ((local_4c8 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,"-d and -r options cannot be specified at the same time",
                     0x36);
          local_468 = (undefined1  [8])local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
          sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
          goto LAB_00104aba;
        }
        local_508._M_dataplus._M_p = (pointer)0x0;
        local_508._M_string_length = 0;
        local_508.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string((string *)&local_2d0,ya_optarg,(allocator *)local_468);
        bVar2 = sptk::ConvertStringToDouble(&local_2d0,(double *)&local_4c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        if (bVar2) {
          if (local_508._M_string_length == local_508.field_2._M_allocated_capacity) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_508,
                       (iterator)local_508._M_string_length,(double *)&local_4c0);
          }
          else {
            *(ulong *)local_508._M_string_length =
                 CONCAT44(local_4c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_4c0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start);
            local_508._M_string_length = local_508._M_string_length + 8;
          }
          for (; ya_optind < (int)local_4d8; ya_optind = ya_optind + 1) {
            std::__cxx11::string::string
                      ((string *)&local_2d0,argv[ya_optind],(allocator *)local_468);
            bVar1 = sptk::ConvertStringToDouble(&local_2d0,(double *)&local_4c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p);
            }
            if (!bVar1) break;
            if (local_508._M_string_length == local_508.field_2._M_allocated_capacity) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&local_508,
                         (iterator)local_508._M_string_length,(double *)&local_4c0);
            }
            else {
              *(ulong *)local_508._M_string_length =
                   CONCAT44(local_4c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_4c0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
              local_508._M_string_length = local_508._M_string_length + 8;
            }
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&local_488,(value_type *)&local_508);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,"The argument for the -d option must be numeric",0x2e);
          local_468 = (undefined1  [8])local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
          sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
          if (local_468 != (undefined1  [8])local_458) {
            operator_delete((void *)local_468);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d0);
          std::ios_base::~ios_base(local_260);
          local_514 = 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_508._M_dataplus._M_p);
        }
        break;
      default:
switchD_00103be7_caseD_65:
        local_514 = 1;
        anon_unknown.dwarf_4a1f::PrintUsage((ostream *)&std::cerr);
        goto LAB_00104afd;
      case 0x66:
        local_2e0 = CONCAT71((int7)((ulong)((long)&switchD_00103be7::switchdataD_00117020 +
                                           (long)(int)(&switchD_00103be7::switchdataD_00117020)
                                                      [iVar4 - 100U]) >> 8),1);
        break;
      case 0x68:
        local_514 = 0;
        anon_unknown.dwarf_4a1f::PrintUsage((ostream *)&std::cout);
        goto LAB_00104afd;
      case 0x6b:
        std::__cxx11::string::string((string *)&local_2d0,ya_optarg,(allocator *)local_468);
        bVar16 = sptk::ConvertStringToInteger(&local_2d0,&local_4dc);
        bVar1 = local_4dc < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        argv = local_4d0;
        if (!bVar16 || bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,
                     "The argument for the -k option must be a positive integer",0x39);
          local_468 = (undefined1  [8])local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
          sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
          goto LAB_00104aba;
        }
        break;
      case 0x6c:
        std::__cxx11::string::string((string *)&local_2d0,ya_optarg,(allocator *)local_468);
        bVar1 = sptk::ConvertStringToInteger(&local_2d0,&local_50c);
        bVar2 = local_50c < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        if (!bVar1 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,
                     "The argument for the -l option must be a positive integer",0x39);
          local_468 = (undefined1  [8])local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
          sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
          goto LAB_00104aba;
        }
        local_50c = local_50c + -1;
LAB_00103e93:
        bVar2 = true;
        argv = local_4d0;
        break;
      case 0x6d:
        std::__cxx11::string::string((string *)&local_2d0,ya_optarg,(allocator *)local_468);
        bVar1 = sptk::ConvertStringToInteger(&local_2d0,&local_50c);
        bVar16 = local_50c < 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        argv = local_4d0;
        if (!bVar1 || bVar16) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,"The argument for the -m option must be a ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,"non-negative integer",0x14);
          local_468 = (undefined1  [8])local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
          sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
          goto LAB_00104aba;
        }
        break;
      case 0x72:
        if ((local_4c8 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,"-r option cannot be specified multiple times",0x2c);
          local_468 = (undefined1  [8])local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
          sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
          goto LAB_00104aba;
        }
        local_508._M_dataplus._M_p = (pointer)0x0;
        local_508._M_string_length = 0;
        local_508.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string((string *)&local_2d0,ya_optarg,(allocator *)local_468);
        bVar2 = sptk::ConvertStringToInteger(&local_2d0,(int *)&local_4c0);
        if (bVar2) {
          bVar2 = sptk::ComputeFirstOrderRegressionCoefficients
                            ((int)local_4c0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                             (vector<double,_std::allocator<double>_> *)&local_508);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p);
          }
          if (!bVar2) goto LAB_001040f5;
          bVar2 = true;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&local_488,(value_type *)&local_508);
        }
        else {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p);
          }
LAB_001040f5:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d0,
                     "The argument for the -r option must be positive integer(s)",0x3a);
          local_468 = (undefined1  [8])local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
          sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
          if (local_468 != (undefined1  [8])local_458) {
            operator_delete((void *)local_468);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d0);
          std::ios_base::~ios_base(local_260);
          local_514 = 1;
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_508._M_dataplus._M_p);
        }
        if (!bVar2) goto LAB_00104afd;
        piVar6 = (int *)(long)ya_optind;
        if (ya_optind < (int)local_4d8) {
          std::__cxx11::string::string
                    ((string *)&local_2d0,argv[(long)piVar6],(allocator *)local_468);
          bVar2 = sptk::ConvertStringToInteger(&local_2d0,(int *)&local_4c0);
          piVar6 = (int *)&local_2d0.field_2;
          if ((int *)local_2d0._M_dataplus._M_p != piVar6) {
            operator_delete(local_2d0._M_dataplus._M_p);
            piVar6 = (int *)extraout_RAX_02;
          }
          if (bVar2) {
            local_508._M_dataplus._M_p = (pointer)0x0;
            local_508._M_string_length = 0;
            local_508.field_2._M_allocated_capacity = 0;
            bVar2 = sptk::ComputeSecondOrderRegressionCoefficients
                              ((int)local_4c0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                               (vector<double,_std::allocator<double>_> *)&local_508);
            if (bVar2) {
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::push_back(&local_488,(value_type *)&local_508);
              piVar6 = &ya_optind;
              ya_optind = ya_optind + 1;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2d0,
                         "The argument for the -r option must be positive integer(s)",0x3a);
              local_468 = (undefined1  [8])local_458;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
              sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
              if (local_468 != (undefined1  [8])local_458) {
                operator_delete((void *)local_468);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d0);
              piVar6 = (int *)std::ios_base::~ios_base(local_260);
              local_514 = 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_508._M_dataplus._M_p);
              piVar6 = (int *)extraout_RAX_03;
            }
            if (!bVar2) goto LAB_00104afd;
          }
        }
        bVar2 = true;
        local_4c8 = CONCAT71((int7)((ulong)piVar6 >> 8),1);
      }
    }
    else if (iVar4 == 0x4d) {
      std::__cxx11::string::string((string *)&local_2d0,ya_optarg,(allocator *)local_468);
      bVar1 = sptk::ConvertStringToInteger(&local_2d0,&local_510);
      bVar16 = local_510 < 0;
      paVar5 = &local_2d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar5) {
        operator_delete(local_2d0._M_dataplus._M_p);
        paVar5 = extraout_RAX_01;
      }
      bVar2 = true;
      local_470 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
      argv = local_4d0;
      if (!bVar1 || bVar16) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d0,"The argument for the -M option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d0,"non-negative integer",0x14);
        local_468 = (undefined1  [8])local_458;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
        sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
        goto LAB_00104aba;
      }
    }
    else {
      if (iVar4 != 1000) goto switchD_00103be7_caseD_65;
      std::__cxx11::string::string((string *)&local_2d0,ya_optarg,(allocator *)local_468);
      bVar1 = sptk::ConvertStringToDouble(&local_2d0,&local_2d8);
      paVar5 = &local_2d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar5) {
        operator_delete(local_2d0._M_dataplus._M_p);
        paVar5 = extraout_RAX_00;
      }
      bVar2 = true;
      local_2e8 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d0,"The argument for the -magic option must be a number",0x33)
        ;
        local_468 = (undefined1  [8])local_458;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
        sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
        goto LAB_00104aba;
      }
    }
LAB_001043ae:
  } while (bVar2 != false);
  goto LAB_00104afd;
LAB_00104b70:
  do {
    bVar2 = sptk::ReadStream<double>
                      ((double *)
                       (CONCAT44(local_4c0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_4c0.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start) + lVar14),
                       (istream *)&local_2d0);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_468,"Failed to load mixture weight",0x1d);
      local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vc","");
      sptk::PrintErrorMessage(&local_508,(ostringstream *)local_468);
LAB_00105304:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
LAB_00104eb2:
        operator_delete(local_508._M_dataplus._M_p);
      }
LAB_00104eb7:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
      std::ios_base::~ios_base(local_3f8);
      local_514 = 1;
LAB_00104ee0:
      std::ifstream::~ifstream(&local_2d0);
      goto LAB_00104eed;
    }
    bVar2 = sptk::ReadStream<double>
                      (false,0,0,iVar4,
                       (vector<double,_std::allocator<double>_> *)
                       ((long)&((local_90.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar15),(istream *)&local_2d0,
                       (int *)0x0);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_468,"Failed to load mean vector",0x1a);
      local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vc","");
      sptk::PrintErrorMessage(&local_508,(ostringstream *)local_468);
      goto LAB_00105304;
    }
    sptk::SymmetricMatrix::Resize
              ((SymmetricMatrix *)
               ((long)&(local_a8.
                        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix + lVar12),
               iVar4);
    if ((local_2e0 & 1) == 0) {
      local_4a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_4a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_4a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar2 = sptk::ReadStream<double>(false,0,0,iVar4,&local_4a8,(istream *)&local_2d0,(int *)0x0);
      if (bVar2) {
        sptk::SymmetricMatrix::SetDiagonal
                  ((SymmetricMatrix *)
                   ((long)&(local_a8.
                            super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                   lVar12),&local_4a8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_468,"Failed to load diagonal covariance vector",0x29);
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vc","");
        sptk::PrintErrorMessage(&local_508,(ostringstream *)local_468);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
        std::ios_base::~ios_base(local_3f8);
        local_514 = 1;
      }
      if (local_4a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar4 = (int)local_4d0;
      if (bVar2) goto LAB_00104cff;
      goto LAB_00104ee0;
    }
    bVar2 = sptk::ReadStream((SymmetricMatrix *)
                             ((long)&(local_a8.
                                      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                     _vptr_SymmetricMatrix + lVar12),(istream *)&local_2d0);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_468,"Failed to load covariance matrix",0x20);
      local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vc","");
      sptk::PrintErrorMessage(&local_508,(ostringstream *)local_468);
      goto LAB_00105304;
    }
LAB_00104cff:
    lVar11 = lVar11 + 1;
    lVar14 = lVar14 + 8;
    lVar15 = lVar15 + 0x18;
    lVar12 = lVar12 + 0x40;
  } while (lVar11 < local_4dc);
LAB_00104d1c:
  std::ifstream::~ifstream(&local_2d0);
  local_4a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_4a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_4a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  input_stream = &local_2d0;
  std::ifstream::ifstream(input_stream);
  pcVar10 = local_4d8;
  if ((local_4d8 == (char *)0x0) ||
     (std::ifstream::open((char *)&local_2d0,(_Ios_Openmode)local_4d8),
     (abStack_2b0[*(long *)(local_2d0._M_dataplus._M_p + -0x18)] & 5) == 0)) {
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      input_stream = (string *)&std::cin;
    }
    uVar9 = (long)local_488.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_488.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = local_50c + 1;
    local_468 = (undefined1  [8])0x0;
    pdStack_460 = (double *)0x0;
    local_458[0]._M_allocated_capacity = (double *)0x0;
    while (bVar2 = sptk::ReadStream<double>
                             (false,0,0,iVar4 * ((int)(uVar9 >> 3) * -0x55555555 + 1),
                              (value_type *)local_468,(istream *)input_stream,(int *)0x0), bVar2) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&local_4a8,(value_type *)local_468);
    }
    if (local_468 != (undefined1  [8])0x0) {
      operator_delete((void *)local_468);
    }
    std::ifstream::~ifstream(&local_2d0);
    local_c8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sptk::GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion
              ((GaussianMixtureModelBasedConversion *)local_468,local_50c,local_510,&local_488,
               &local_4c0,&local_90,&local_a8,(bool)((byte)local_2e8 & 1),local_2d8);
    if (local_3e0 == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2d0,"Failed to initialize GaussianMixtureModelBasedConversion",
                 0x38);
      local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vc","");
      sptk::PrintErrorMessage(&local_508,(ostringstream *)&local_2d0);
LAB_00105248:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        operator_delete(local_508._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d0);
      std::ios_base::~ios_base(local_260);
      sptk::GaussianMixtureModelBasedConversion::~GaussianMixtureModelBasedConversion
                ((GaussianMixtureModelBasedConversion *)local_468);
LAB_00105285:
      local_514 = 1;
    }
    else {
      bVar2 = sptk::GaussianMixtureModelBasedConversion::Run
                        ((GaussianMixtureModelBasedConversion *)local_468,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)&local_4a8,&local_c8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d0,"Failed to perform voice conversion",0x22);
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vc","");
        sptk::PrintErrorMessage(&local_508,(ostringstream *)&local_2d0);
        goto LAB_00105248;
      }
      sptk::GaussianMixtureModelBasedConversion::~GaussianMixtureModelBasedConversion
                ((GaussianMixtureModelBasedConversion *)local_468);
      uVar13 = (int)((long)local_c8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_c8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
      if (0 < (int)uVar13) {
        uVar9 = (ulong)(uVar13 & 0x7fffffff);
        lVar11 = 0;
        do {
          bVar2 = sptk::WriteStream<double>
                            (0,local_510 + 1,
                             (vector<double,_std::allocator<double>_> *)
                             ((long)&((local_c8.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data._M_start + lVar11),
                             (ostream *)&std::cout,(int *)0x0);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2d0,"Failed to write target vectors",0x1e);
            local_468 = (undefined1  [8])local_458;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"vc","");
            sptk::PrintErrorMessage((string *)local_468,(ostringstream *)&local_2d0);
            if (local_468 != (undefined1  [8])local_458) {
              operator_delete((void *)local_468);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d0);
            std::ios_base::~ios_base(local_260);
            goto LAB_00105285;
          }
          lVar11 = lVar11 + 0x18;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      local_514 = 0;
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_c8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_468,"Cannot open file ",0x11);
    sVar8 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468,pcVar10,sVar8);
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vc","");
    sptk::PrintErrorMessage(&local_508,(ostringstream *)local_468);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    std::ifstream::~ifstream(&local_2d0);
    local_514 = 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_4a8);
LAB_00104eed:
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector(&local_a8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_90);
  if ((void *)CONCAT44(local_4c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       (int)local_4c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_4c0.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_4c0.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start));
  }
LAB_00104afd:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_488);
  return local_514;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_source_order(kDefaultNumOrder);
  int num_target_order(kDefaultNumOrder);
  bool is_num_target_order_specified(false);
  int num_mixture(kDefaultNumMixture);
  bool full_covariance_flag(kDefaultFullCovarianceFlag);
  std::vector<std::vector<double> > window_coefficients;
  bool is_regression_specified(false);
  double magic_number(0.0);
  bool is_magic_number_specified(false);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:L:M:k:fd:D:r:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_source_order) ||
            num_source_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        --num_source_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_source_order) ||
            num_source_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToInteger(optarg, &num_target_order) ||
            num_target_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        --num_target_order;
        is_num_target_order_specified = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &num_target_order) ||
            num_target_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        is_num_target_order_specified = true;
        break;
      }
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_mixture) ||
            num_mixture <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -k option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        full_covariance_flag = true;
        break;
      }
      case 'd': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-d and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        std::vector<double> coefficients;
        double coefficient;
        if (!sptk::ConvertStringToDouble(optarg, &coefficient)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be numeric";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        coefficients.push_back(coefficient);
        while (optind < argc &&
               sptk::ConvertStringToDouble(argv[optind], &coefficient)) {
          coefficients.push_back(coefficient);
          ++optind;
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'D': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-D and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        std::ifstream ifs;
        ifs.open(optarg, std::ios::in | std::ios::binary);
        if (ifs.fail()) {
          std::ostringstream error_message;
          error_message << "Cannot open file " << optarg;
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        std::vector<double> coefficients;
        double coefficient;
        while (sptk::ReadStream(&coefficient, &ifs)) {
          coefficients.push_back(coefficient);
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'r': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message << "-r option cannot be specified multiple times";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        int n;
        // Set first order coefficients.
        {
          std::vector<double> coefficients;
          if (!sptk::ConvertStringToInteger(optarg, &n) ||
              !sptk::ComputeFirstOrderRegressionCoefficients(n,
                                                             &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("vc", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
        }

        // Set second order coefficients.
        if (optind < argc && sptk::ConvertStringToInteger(argv[optind], &n)) {
          std::vector<double> coefficients;
          if (!sptk::ComputeSecondOrderRegressionCoefficients(n,
                                                              &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("vc", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
          ++optind;
        }
        is_regression_specified = true;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!is_num_target_order_specified) {
    num_target_order = num_source_order;
  }

  // Get input file names.
  const char* gmm_file;
  const char* input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    gmm_file = argv[argc - 2];
    input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    gmm_file = argv[argc - 1];
    input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, gmmfile and infile, are required";
    sptk::PrintErrorMessage("vc", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vc", error_message);
    return 1;
  }

  // Load GMM.
  std::vector<double> weights(num_mixture);
  std::vector<std::vector<double> > mean_vectors(num_mixture);
  std::vector<sptk::SymmetricMatrix> covariance_matrices(num_mixture);
  {
    std::ifstream ifs;
    ifs.open(gmm_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << gmm_file;
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    const int read_size(static_cast<int>(window_coefficients.size() + 1) *
                        (num_source_order + num_target_order + 2));
    for (int k(0); k < num_mixture; ++k) {
      if (!sptk::ReadStream(&(weights[k]), &input_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to load mixture weight";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }

      if (!sptk::ReadStream(false, 0, 0, read_size, &mean_vectors[k],
                            &input_stream, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to load mean vector";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }

      covariance_matrices[k].Resize(read_size);
      if (full_covariance_flag) {
        if (!sptk::ReadStream(&covariance_matrices[k], &input_stream)) {
          std::ostringstream error_message;
          error_message << "Failed to load covariance matrix";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
      } else {
        std::vector<double> variance;
        if (!sptk::ReadStream(false, 0, 0, read_size, &variance, &input_stream,
                              NULL)) {
          std::ostringstream error_message;
          error_message << "Failed to load diagonal covariance vector";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        covariance_matrices[k].SetDiagonal(variance);
      }
    }
  }

  // Read input vectors.
  std::vector<std::vector<double> > source_vectors;
  {
    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    const int read_size(static_cast<int>(window_coefficients.size() + 1) *
                        (num_source_order + 1));
    std::vector<double> tmp;
    while (
        sptk::ReadStream(false, 0, 0, read_size, &tmp, &input_stream, NULL)) {
      source_vectors.push_back(tmp);
    }
  }

  // Perform voice conversion.
  std::vector<std::vector<double> > target_vectors;
  {
    sptk::GaussianMixtureModelBasedConversion conversion(
        num_source_order, num_target_order, window_coefficients, weights,
        mean_vectors, covariance_matrices, is_magic_number_specified,
        magic_number);
    if (!conversion.IsValid()) {
      std::ostringstream error_message;
      error_message
          << "Failed to initialize GaussianMixtureModelBasedConversion";
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
    if (!conversion.Run(source_vectors, &target_vectors)) {
      std::ostringstream error_message;
      error_message << "Failed to perform voice conversion";
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
  }

  // Write output vectors.
  {
    const int sequence_length(static_cast<int>(target_vectors.size()));
    for (int t(0); t < sequence_length; ++t) {
      if (!sptk::WriteStream(0, num_target_order + 1, target_vectors[t],
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write target vectors";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }
    }
  }

  return 0;
}